

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_discard(strpool_t *pool,unsigned_long_long handle)

{
  int iVar1;
  uint uVar2;
  strpool_internal_block_t *psVar3;
  int *piVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  strpool_internal_entry_t *psVar8;
  int *piVar9;
  strpool_internal_entry_t *psVar10;
  int base_slot;
  uint hash;
  strpool_internal_free_block_t *prev_entry;
  strpool_internal_free_block_t *new_entry_1;
  strpool_internal_free_block_t *free_entry;
  int prev_list;
  int free_list;
  strpool_internal_free_block_t *new_entry;
  strpool_internal_block_t *block;
  int i;
  int entry_index;
  strpool_internal_entry_t *entry;
  unsigned_long_long handle_local;
  strpool_t *pool_local;
  
  psVar8 = strpool_internal_get_entry(pool,handle);
  if ((psVar8 != (strpool_internal_entry_t *)0x0) && (psVar8->refcount == 0)) {
    iVar1 = pool->handles[psVar8->handle_index].entry_index;
    for (block._0_4_ = 0; (int)block < pool->block_count; block._0_4_ = (int)block + 1) {
      psVar3 = pool->blocks;
      if ((psVar3[(int)block].data <= psVar8->data) && (psVar8->data <= psVar3[(int)block].tail)) {
        if (-1 < psVar3[(int)block].free_list) {
          free_entry._4_4_ = psVar3[(int)block].free_list;
          free_entry._0_4_ = -1;
          goto LAB_001083ca;
        }
        piVar9 = (int *)psVar8->data;
        psVar3[(int)block].free_list = (int)psVar8->data - (int)psVar3[(int)block].data;
        piVar9[1] = -1;
        *piVar9 = psVar8->size;
        break;
      }
    }
LAB_001084e9:
    if (pool->handle_freelist_tail < 0) {
      if (-1 < pool->handle_freelist_head) {
        __assert_fail("pool->handle_freelist_head < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x459,"void strpool_discard(strpool_t *, unsigned long long)");
      }
      pool->handle_freelist_head = psVar8->handle_index;
      pool->handle_freelist_tail = psVar8->handle_index;
    }
    else {
      pool->handles[pool->handle_freelist_tail].entry_index = psVar8->handle_index;
      pool->handle_freelist_tail = psVar8->handle_index;
    }
    pool->handles[psVar8->handle_index].counter = pool->handles[psVar8->handle_index].counter + 1;
    pool->handles[psVar8->handle_index].entry_index = -1;
    uVar2 = pool->hash_table[psVar8->hash_slot].hash_key;
    uVar7 = uVar2 & pool->hash_capacity - 1U;
    if (uVar2 == 0) {
      __assert_fail("hash",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x468,"void strpool_discard(strpool_t *, unsigned long long)");
    }
    pool->hash_table[(int)uVar7].base_count = pool->hash_table[(int)uVar7].base_count + -1;
    pool->hash_table[psVar8->hash_slot].hash_key = 0;
    if (iVar1 != pool->entry_count + -1) {
      psVar8 = pool->entries + iVar1;
      psVar10 = pool->entries + (pool->entry_count + -1);
      iVar5 = psVar10->handle_index;
      psVar8->hash_slot = psVar10->hash_slot;
      psVar8->handle_index = iVar5;
      psVar8->data = psVar10->data;
      iVar5 = psVar10->length;
      psVar8->size = psVar10->size;
      psVar8->length = iVar5;
      uVar6 = *(undefined4 *)&psVar10->field_0x1c;
      psVar8->refcount = psVar10->refcount;
      *(undefined4 *)&psVar8->field_0x1c = uVar6;
      pool->hash_table[pool->entries[iVar1].hash_slot].entry_index = iVar1;
      pool->handles[pool->entries[iVar1].handle_index].entry_index = iVar1;
    }
    pool->entry_count = pool->entry_count + -1;
  }
  return;
LAB_001083ca:
  if (free_entry._4_4_ < 0) goto LAB_001084e9;
  piVar9 = (int *)(pool->blocks[(int)block].data + free_entry._4_4_);
  if (*piVar9 <= psVar8->size) {
    piVar4 = (int *)psVar8->data;
    if ((int)free_entry < 0) {
      piVar4[1] = pool->blocks[(int)block].free_list;
      pool->blocks[(int)block].free_list = (int)psVar8->data - (int)psVar3[(int)block].data;
    }
    else {
      *(int *)(pool->blocks[(int)block].data + (long)(int)free_entry + 4) =
           (int)psVar8->data - (int)psVar3[(int)block].data;
      piVar4[1] = piVar9[1];
    }
    *piVar4 = psVar8->size;
    goto LAB_001084e9;
  }
  free_entry._0_4_ = free_entry._4_4_;
  free_entry._4_4_ = piVar9[1];
  goto LAB_001083ca;
}

Assistant:

void strpool_discard( strpool_t* pool, STRPOOL_U64 handle )
    {   
    strpool_internal_entry_t* entry = strpool_internal_get_entry( pool, handle );
    if( entry && entry->refcount == 0 )
        {
        int entry_index = pool->handles[ entry->handle_index ].entry_index;

        // recycle string mem
        for( int i = 0; i < pool->block_count; ++i )
            {
            strpool_internal_block_t* block = &pool->blocks[ i ];
            if( entry->data >= block->data && entry->data <= block->tail )
                {
                if( block->free_list < 0 )
                    {
                    strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                    block->free_list = (int) ( entry->data - block->data );
                    new_entry->next = -1;
                    new_entry->size = entry->size;
                    }
                else
                    {
                    int free_list = block->free_list;
                    int prev_list = -1;
                    while( free_list >= 0 )
                        {
                        strpool_internal_free_block_t* free_entry = 
                            (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + free_list );
                        if( free_entry->size <= entry->size ) 
                            {
                            strpool_internal_free_block_t* new_entry = (strpool_internal_free_block_t*) ( entry->data );
                            if( prev_list < 0 )
                                {
                                new_entry->next = pool->blocks[ i ].free_list;
                                pool->blocks[ i ].free_list = (int) ( entry->data - block->data );          
                                }
                            else
                                {
                                strpool_internal_free_block_t* prev_entry = 
                                    (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + prev_list );
                                prev_entry->next = (int) ( entry->data - block->data );
                                new_entry->next = free_entry->next;
                                }
                            new_entry->size = entry->size;
                            break;
                            }
                        prev_list = free_list;
                        free_list = free_entry->next;
                        }
                    }
                break;
                }
            }

        // recycle handle
        if( pool->handle_freelist_tail < 0 )
            {
            STRPOOL_ASSERT( pool->handle_freelist_head < 0 );
            pool->handle_freelist_head = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        else
            {
            pool->handles[ pool->handle_freelist_tail ].entry_index = entry->handle_index;
            pool->handle_freelist_tail = entry->handle_index;
            }
        ++pool->handles[ entry->handle_index ].counter; // invalidate handle via counter
        pool->handles[ entry->handle_index ].entry_index = -1;

        // recycle hash slot
        STRPOOL_U32 hash = pool->hash_table[ entry->hash_slot ].hash_key;
        int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        STRPOOL_ASSERT( hash );
        --pool->hash_table[ base_slot ].base_count;
        pool->hash_table[ entry->hash_slot ].hash_key = 0;

        // recycle entry
        if( entry_index != pool->entry_count - 1 )
            {
            pool->entries[ entry_index ] = pool->entries[ pool->entry_count - 1 ];
            pool->hash_table[ pool->entries[ entry_index ].hash_slot ].entry_index = entry_index;
            pool->handles[ pool->entries[ entry_index ].handle_index ].entry_index = entry_index;
            }
        --pool->entry_count;
        }       

    }